

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Logger::Logger(Logger *this,string *id,Configurations *configurations,
                  LogStreamsReferenceMap *logStreamsReference)

{
  undefined8 in_RCX;
  Logger *in_RSI;
  undefined8 *in_RDI;
  Configurations *in_stack_ffffffffffffffa0;
  Configurations *configurations_00;
  Logger *in_stack_ffffffffffffffd0;
  
  el::base::threading::ThreadSafe::ThreadSafe((ThreadSafe *)0x227697);
  Loggable::Loggable((Loggable *)(in_RDI + 2));
  *in_RDI = &PTR_acquireLock_00299580;
  in_RDI[2] = &PTR__Logger_002995c0;
  configurations_00 = (Configurations *)(in_RDI + 3);
  std::__cxx11::string::string((string *)configurations_00,(string *)in_RSI);
  in_RDI[7] = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x39));
  *(undefined1 *)(in_RDI + 0x3d) = 0;
  Configurations::Configurations(in_stack_ffffffffffffffa0);
  el::base::utils::std::
  unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::unordered_map((unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                   *)0x22773b);
  in_RDI[0x4f] = in_RCX;
  el::base::utils::std::shared_ptr<el::LogBuilder>::shared_ptr
            ((shared_ptr<el::LogBuilder> *)0x22775d);
  initUnflushedCount(in_RSI);
  configure(in_stack_ffffffffffffffd0,configurations_00);
  return;
}

Assistant:

Logger::Logger(const std::string& id, const Configurations& configurations,
               base::LogStreamsReferenceMap* logStreamsReference) :
  m_id(id),
  m_typedConfigurations(nullptr),
  m_parentApplicationName(std::string()),
  m_isConfigured(false),
  m_logStreamsReference(logStreamsReference) {
  initUnflushedCount();
  configure(configurations);
}